

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O0

void cppcms::impl::md5_append(md5_state_t *pms,md5_byte_t *data,int nbytes)

{
  uint uVar1;
  int in_EDX;
  void *in_RSI;
  uint *in_RDI;
  int copy;
  md5_word_t nbits;
  int offset;
  int left;
  md5_byte_t *p;
  md5_byte_t *in_stack_00000038;
  md5_state_t *in_stack_00000040;
  int local_34;
  int local_24;
  void *local_20;
  
  uVar1 = *in_RDI >> 3 & 0x3f;
  if (0 < in_EDX) {
    in_RDI[1] = (in_EDX >> 0x1d) + in_RDI[1];
    *in_RDI = in_EDX * 8 + *in_RDI;
    if (*in_RDI < (uint)(in_EDX * 8)) {
      in_RDI[1] = in_RDI[1] + 1;
    }
    local_24 = in_EDX;
    local_20 = in_RSI;
    if (uVar1 != 0) {
      local_34 = in_EDX;
      if (0x40 < (int)(uVar1 + in_EDX)) {
        local_34 = 0x40 - uVar1;
      }
      memcpy((void *)((long)in_RDI + (long)(int)uVar1 + 0x18),in_RSI,(long)local_34);
      if ((int)(uVar1 + local_34) < 0x40) {
        return;
      }
      local_20 = (void *)((long)in_RSI + (long)local_34);
      local_24 = in_EDX - local_34;
      md5_process(in_stack_00000040,in_stack_00000038);
    }
    for (; 0x3f < local_24; local_24 = local_24 + -0x40) {
      md5_process(in_stack_00000040,in_stack_00000038);
      local_20 = (void *)((long)local_20 + 0x40);
    }
    if (local_24 != 0) {
      memcpy(in_RDI + 6,local_20,(long)local_24);
    }
  }
  return;
}

Assistant:

void
md5_append(md5_state_t *pms, const md5_byte_t *data, int nbytes)
{
    const md5_byte_t *p = data;
    int left = nbytes;
    int offset = (pms->count[0] >> 3) & 63;
    md5_word_t nbits = (md5_word_t)(nbytes << 3);

    if (nbytes <= 0)
	return;

    /* Update the message length. */
    pms->count[1] += nbytes >> 29;
    pms->count[0] += nbits;
    if (pms->count[0] < nbits)
	pms->count[1]++;

    /* Process an initial partial block. */
    if (offset) {
	int copy = (offset + nbytes > 64 ? 64 - offset : nbytes);

	memcpy(pms->buf + offset, p, copy);
	if (offset + copy < 64)
	    return;
	p += copy;
	left -= copy;
	md5_process(pms, pms->buf);
    }

    /* Process full blocks. */
    for (; left >= 64; p += 64, left -= 64)
	md5_process(pms, p);

    /* Process a final partial block. */
    if (left)
	memcpy(pms->buf, p, left);
}